

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall
Memory::HeapBlockMap32::VerifyMarkCountForPages<2048u>
          (HeapBlockMap32 *this,void *address,uint pageCount)

{
  L2MapChunk *this_00;
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  PageMarkBitVector *this_01;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined4 *puVar7;
  undefined8 *in_FS_OFFSET;
  
  this_00 = this->map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)*in_FS_OFFSET;
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x15e,"(l2map != nullptr)","l2map != nullptr");
    if (!bVar2) goto LAB_0023adff;
    *puVar7 = 0;
  }
  uVar5 = (uint)address >> 0xc;
  uVar4 = (uVar5 & 0xff) + pageCount;
  if (uVar4 < 0x101) {
    puVar7 = (undefined4 *)*in_FS_OFFSET;
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)*in_FS_OFFSET;
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x162,"(id2 + pageCount <= L2Count)","id2 + pageCount <= L2Count");
    if (!bVar2) {
LAB_0023adff:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar7 = 0;
  }
  uVar6 = (ulong)(uVar5 & 0xff);
  do {
    if (uVar4 <= uVar6) {
      return;
    }
    this_01 = L2MapChunk::GetPageMarkBitVector(this_00,(uint)uVar6);
    BVar3 = BVStatic<256UL>::Count(this_01);
    if (BVar3 != this_00->pageMarkCount[uVar6]) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0x16a,"(markCountForPage == l2map->pageMarkCount[i])",
                         "markCountForPage == l2map->pageMarkCount[i]");
      if (!bVar2) goto LAB_0023adff;
      *puVar7 = 0;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void
HeapBlockMap32::VerifyMarkCountForPages(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * l2map = map[id1];
    Assert(l2map != nullptr);

    uint id2 = GetLevel2Id(address);

    Assert(id2 + pageCount <= L2Count);
    for (uint i = id2; i < pageCount + id2; i++)
    {
        uint markCountForPage = l2map->GetPageMarkBitVector(i)->Count();
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        DebugOnly(HeapBlock * heapBlock = this->GetHeapBlock(address));
        Assert(markCountForPage == l2map->pageMarkCount[i] || heapBlock->WasAllocatedFromDuringSweep());
#else
        Assert(markCountForPage == l2map->pageMarkCount[i]);
#endif
    }
}